

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int detect_form(archive_read *a,int *is_form_d)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  byte *b;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  ssize_t sVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  byte *p;
  byte *pbVar14;
  ulong uVar15;
  bool bVar16;
  ssize_t avail;
  ssize_t nl;
  int local_68;
  int local_64;
  ulong local_60;
  int local_54;
  ulong local_50;
  ulong local_48;
  archive_read *local_40;
  int *local_38;
  
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  local_40 = a;
  b = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_60);
  if (b == (byte *)0x0) {
    iVar3 = -1;
  }
  else {
    local_64 = 0;
    local_54 = 0;
    local_68 = 0;
    uVar11 = local_60;
    local_38 = is_form_d;
LAB_003db3ff:
    uVar15 = local_60;
    if (local_60 == 0) {
      local_48 = 0;
      uVar4 = 0;
LAB_003db43a:
      uVar8 = uVar15;
      if (uVar4 == uVar15) {
        while( true ) {
          if (0xfffff < (long)uVar8) {
            uVar4 = 1;
            goto LAB_003db89f;
          }
          uVar15 = (ulong)((int)uVar11 + 0x3ffU & 0xfffffc00);
          pvVar5 = __archive_read_ahead
                             (local_40,uVar15 << (uVar15 < uVar11 + 0xa0),(ssize_t *)&local_60);
          pvVar6 = pvVar5;
          if (pvVar5 == (void *)0x0) {
            if ((long)local_60 <= (long)uVar11) {
              uVar4 = 0;
              goto LAB_003db89f;
            }
            pvVar6 = __archive_read_ahead(local_40,local_60,(ssize_t *)&local_60);
          }
          uVar13 = local_60;
          uVar15 = local_60 - (uVar11 - uVar8);
          local_60 = uVar15;
          sVar7 = get_line_size((char *)((long)pvVar6 + uVar11),uVar15 - uVar8,(ssize_t *)&local_48)
          ;
          uVar4 = 0;
          if (-1 < sVar7) {
            uVar4 = uVar8;
          }
          uVar4 = uVar4 + sVar7;
          if (local_48 != 0) break;
          if ((pvVar5 == (void *)0x0) || (uVar11 = uVar13, uVar8 = uVar15, uVar4 != uVar15))
          goto LAB_003db89f;
        }
        b = (byte *)((long)pvVar6 + (uVar11 - uVar8));
        local_50 = uVar13;
        uVar11 = local_50;
        goto LAB_003db50e;
      }
    }
    else {
      uVar4 = get_line_size((char *)b,local_60,(ssize_t *)&local_48);
      if (local_48 == 0) goto LAB_003db43a;
LAB_003db50e:
      local_50 = uVar11;
      uVar11 = local_48;
      if ((long)uVar4 < 1) goto LAB_003db89f;
      if (local_54 != 0) {
        iVar3 = bid_keyword_list((char *)b,uVar4,0,0);
        if (iVar3 < 1) {
LAB_003db8db:
          uVar4 = 1;
          goto LAB_003db89f;
        }
        b = b + uVar4;
        if ((b[~uVar11] != 0x5c) && (bVar16 = local_54 == 1, local_54 = 0, bVar16)) {
          if (1 < local_64) goto LAB_003db8b1;
          local_64 = local_64 + 1;
          local_54 = 0;
        }
        local_60 = uVar15 - uVar4;
        uVar11 = local_50;
        goto LAB_003db3ff;
      }
      pbVar14 = b + uVar4;
      do {
        bVar12 = *b;
        if ((bVar12 != 0x20) && (bVar12 != 9)) {
          bVar16 = true;
          goto LAB_003db565;
        }
        b = b + 1;
        uVar15 = uVar15 - 1;
        bVar16 = 1 < (long)uVar4;
        uVar4 = uVar4 - 1;
        local_60 = uVar15;
      } while (bVar16);
      bVar12 = *pbVar14;
      uVar4 = 0;
      bVar16 = false;
      b = pbVar14;
LAB_003db565:
      uVar8 = (ulong)bVar12;
      if (0x22 < bVar12) {
        if (bVar12 == 0x23) goto LAB_003db581;
        if (bVar12 != 0x2f) goto LAB_003db66d;
        if (uVar4 < 5) goto LAB_003db89f;
        iVar3 = strncmp((char *)b,"/set",4);
        if (iVar3 == 0) {
          pbVar14 = b + 4;
          lVar10 = uVar4 - 4;
          iVar3 = 0;
        }
        else {
          if ((uVar4 < 7) || (iVar3 = strncmp((char *)b,"/unset",6), iVar3 != 0)) goto LAB_003db8db;
          pbVar14 = b + 6;
          lVar10 = uVar4 - 6;
          iVar3 = 1;
        }
        iVar3 = bid_keyword_list((char *)pbVar14,lVar10,iVar3,0);
        if (iVar3 < 1) goto LAB_003db8db;
        local_54 = (uint)(b[~uVar11 + uVar4] == 0x5c) * 2;
LAB_003db86b:
        b = b + uVar4;
        local_60 = uVar15 - uVar4;
        uVar11 = local_50;
        goto LAB_003db3ff;
      }
      if ((bVar12 == 10) || (bVar12 == 0xd)) {
LAB_003db581:
        b = b + uVar4;
        local_60 = uVar15 - uVar4;
        uVar11 = local_50;
        goto LAB_003db3ff;
      }
LAB_003db66d:
      pbVar14 = b + uVar4;
      if (!bVar16) {
LAB_003db6d7:
        lVar10 = -local_48;
        if ((((pbVar14 + lVar10 + -2 < b) || (pbVar14[lVar10 + -1] != 0x5c)) ||
            ((bVar12 = pbVar14[lVar10 + -2], bVar12 != 9 && (bVar12 != 0x20)))) &&
           ((b <= pbVar14 + lVar10 + -1 && (bVar12 = pbVar14[lVar10 + -1], bVar12 != 0x5c)))) {
          lVar10 = uVar4 - local_48;
          bVar16 = false;
          uVar9 = 0;
          while( true ) {
            if ((bVar12 == 9) || (bVar12 == 0x20)) goto LAB_003db7b6;
            if (bid_entry_safe_char[bVar12] == '\0') goto LAB_003db89f;
            if (bVar12 == 0x2f) {
              bVar16 = true;
            }
            if (b + lVar10 + -2 < b) break;
            bVar12 = b[lVar10 + -2];
            lVar10 = lVar10 + -1;
            uVar9 = uVar9 + 1;
          }
          lVar10 = lVar10 + -1;
          uVar9 = uVar9 + 1;
LAB_003db7b6:
          if (((uVar9 != 0) && (bVar16)) && (b[lVar10] != 0x2f)) {
            uVar13 = uVar4 - (uVar9 + local_48);
            iVar3 = 1;
            bVar16 = false;
            p = b;
            goto LAB_003db7eb;
          }
        }
        goto LAB_003db89f;
      }
      pcVar1 = bid_entry_safe_char + uVar8;
      p = b;
      uVar13 = uVar4;
      cVar2 = *pcVar1;
      while (cVar2 != '\0') {
        p = p + 1;
        uVar13 = uVar13 - 1;
        if (pbVar14 <= p) goto LAB_003db7a7;
        uVar8 = (ulong)*p;
        cVar2 = bid_entry_safe_char[uVar8];
      }
      if (((0x20 < (byte)uVar8) || ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0)) || (*pcVar1 == '\0')
         ) goto LAB_003db6d7;
      uVar13 = (long)pbVar14 - (long)p;
LAB_003db7a7:
      iVar3 = 0;
      bVar16 = true;
LAB_003db7eb:
      iVar3 = bid_keyword_list((char *)p,uVar13,0,iVar3);
      if (-1 < iVar3) {
        if (local_68 == 1) {
          if ((bool)(bVar16 & iVar3 != 0)) {
            local_68 = 1;
            goto LAB_003db89f;
          }
LAB_003db834:
          if (bVar16) {
LAB_003db839:
            local_54 = 1;
            if (pbVar14[~uVar11] == 0x5c) goto LAB_003db86b;
          }
        }
        else {
          if (local_68 != 0) goto LAB_003db834;
          local_68 = 1;
          if (bVar16) {
            local_68 = -(uint)(iVar3 != 0);
            goto LAB_003db839;
          }
        }
        if (local_64 < 2) {
          local_64 = local_64 + 1;
          local_54 = 0;
          goto LAB_003db86b;
        }
        goto LAB_003db8b1;
      }
    }
LAB_003db89f:
    if (local_64 < 3) {
      if (local_64 < 1) {
        return 0;
      }
      if (uVar4 != 0) {
        return 0;
      }
    }
LAB_003db8b1:
    iVar3 = 0x20;
    if ((local_38 != (int *)0x0) && (local_68 == 1)) {
      *local_38 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}